

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

PositionalBase * __thiscall args::Command::GetNextPositional(Command *this)

{
  Base *this_00;
  bool bVar1;
  int iVar2;
  Options OVar3;
  uint uVar4;
  undefined4 extraout_var;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *this_01;
  reference ppBVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Command *local_58;
  PositionalBase *res_1;
  Base *child;
  const_iterator __end3;
  const_iterator __begin3;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range3;
  PositionalBase *res;
  Command *this_local;
  
  if (this->selectedCommand == (Command *)0x0) {
    if (this->subparser == (Subparser *)0x0) {
      uVar4 = (*(this->super_Group).super_Base._vptr_Base[2])();
      if ((uVar4 & 1) == 0) {
        local_58 = (Command *)0x0;
      }
      else {
        local_58 = (Command *)Group::GetNextPositional(&this->super_Group);
      }
      this_local = local_58;
    }
    else {
      iVar2 = (*(this->subparser->super_Group).super_Base._vptr_Base[8])();
      this_local = (Command *)CONCAT44(extraout_var_01,iVar2);
    }
  }
  else {
    iVar2 = (*(this->selectedCommand->super_Group).super_Base._vptr_Base[8])();
    this_local = (Command *)CONCAT44(extraout_var,iVar2);
    if (this_local == (Command *)0x0) {
      this_01 = Group::Children(&this->super_Group);
      __end3 = std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin(this_01);
      child = (Base *)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                                         *)&child), bVar1) {
        ppBVar5 = __gnu_cxx::
                  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                  ::operator*(&__end3);
        this_00 = *ppBVar5;
        OVar3 = Base::GetOptions(this_00);
        OVar3 = operator&(OVar3,Global);
        if (OVar3 != None) {
          iVar2 = (*this_00->_vptr_Base[8])();
          if ((PositionalBase *)CONCAT44(extraout_var_00,iVar2) != (PositionalBase *)0x0) {
            return (PositionalBase *)CONCAT44(extraout_var_00,iVar2);
          }
        }
        __gnu_cxx::
        __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
        ::operator++(&__end3);
      }
      this_local = (Command *)0x0;
    }
  }
  return (PositionalBase *)this_local;
}

Assistant:

virtual PositionalBase *GetNextPositional() override
            {
                if (selectedCommand != nullptr)
                {
                    if (auto *res = selectedCommand->GetNextPositional())
                    {
                        return res;
                    }

                    for (auto *child: Children())
                    {
                        if ((child->GetOptions() & Options::Global) != Options::None)
                        {
                            if (auto *res = child->GetNextPositional())
                            {
                                return res;
                            }
                        }
                    }

                    return nullptr;
                }

                if (subparser != nullptr)
                {
                    return subparser->GetNextPositional();
                }

                return Matched() ? Group::GetNextPositional() : nullptr;
            }